

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BlitColorConversionCase::render(BlitColorConversionCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  deUint32 internalformat;
  int srcY1;
  Context *pCVar1;
  deUint32 *pdVar2;
  deUint32 *pdVar3;
  int iVar4;
  deUint32 *renderbuffers;
  bool bVar5;
  deUint32 dstFbo;
  DataType local_444;
  DataType local_440;
  deUint32 srcFbo;
  deUint32 srcRbo;
  deUint32 dstRbo;
  BVec4 srcIsGreater;
  BVec4 copyMask;
  Vec3 local_428;
  Vec3 local_418;
  Surface *local_408;
  TextureFormat dstFormat;
  tcu local_3f8 [4];
  tcu local_3f4 [4];
  tcu local_3f0 [4];
  tcu local_3ec [4];
  TextureFormatInfo srcFmtRangeInfo;
  TextureFormatInfo dstFmtRangeInfo;
  TextureFormat srcFormat;
  TextureFormatInfo dstRangeInfo;
  GradientShader gradientToDstShader;
  GradientShader gradientToSrcShader;
  TextureFormatInfo srcRangeInfo;
  
  local_408 = dst;
  srcFormat = glu::mapGLInternalFormat(this->m_srcFormat);
  dstFormat = glu::mapGLInternalFormat(this->m_dstFormat);
  local_444 = FboTestUtil::getFragmentOutputType(&srcFormat);
  local_440 = FboTestUtil::getFragmentOutputType(&dstFormat);
  tcu::getTextureFormatInfo(&srcFmtRangeInfo,&srcFormat);
  tcu::getTextureFormatInfo(&dstFmtRangeInfo,&dstFormat);
  getChannelMask((Functional *)&gradientToSrcShader,srcFormat.order);
  getChannelMask((Functional *)&gradientToDstShader,dstFormat.order);
  tcu::logicalAnd<bool,4>
            ((tcu *)&copyMask,(Vector<bool,_4> *)&gradientToSrcShader,
             (Vector<bool,_4> *)&gradientToDstShader);
  tcu::operator-((tcu *)&gradientToSrcShader,&srcFmtRangeInfo.valueMax,&srcFmtRangeInfo.valueMin);
  tcu::operator-((tcu *)&gradientToDstShader,&dstFmtRangeInfo.valueMax,&dstFmtRangeInfo.valueMin);
  tcu::greaterThan<float,4>
            ((tcu *)&srcIsGreater,(Vector<float,_4> *)&gradientToSrcShader,
             (Vector<float,_4> *)&gradientToDstShader);
  tcu::logicalAnd<bool,4>
            ((tcu *)&local_428,(Vector<bool,_4> *)&copyMask,(Vector<bool,_4> *)&srcIsGreater);
  tcu::select<float,4>
            ((tcu *)&gradientToSrcShader,&dstFmtRangeInfo.valueMin,&srcFmtRangeInfo.valueMin,
             (Vector<bool,_4> *)&local_428);
  tcu::logicalAnd<bool,4>
            ((tcu *)&srcFbo,(Vector<bool,_4> *)&copyMask,(Vector<bool,_4> *)&srcIsGreater);
  tcu::select<float,4>
            ((tcu *)&gradientToDstShader,&dstFmtRangeInfo.valueMax,&srcFmtRangeInfo.valueMax,
             (Vector<bool,_4> *)&srcFbo);
  tcu::logicalAnd<bool,4>
            ((tcu *)&dstFbo,(Vector<bool,_4> *)&copyMask,(Vector<bool,_4> *)&srcIsGreater);
  tcu::select<float,4>
            ((tcu *)&dstRangeInfo,&dstFmtRangeInfo.lookupScale,&srcFmtRangeInfo.lookupScale,
             (Vector<bool,_4> *)&dstFbo);
  tcu::logicalAnd<bool,4>((tcu *)&srcRbo,&copyMask,(Vector<bool,_4> *)&srcIsGreater);
  tcu::select<float,4>
            ((tcu *)&local_418,&dstFmtRangeInfo.lookupBias,&srcFmtRangeInfo.lookupBias,
             (Vector<bool,_4> *)&srcRbo);
  tcu::TextureFormatInfo::TextureFormatInfo
            (&srcRangeInfo,(Vec4 *)&gradientToSrcShader,(Vec4 *)&gradientToDstShader,
             &dstRangeInfo.valueMin,(Vec4 *)&local_418);
  tcu::logicalNot<bool,4>((tcu *)&dstFbo,&copyMask);
  tcu::logicalOr<bool,4>((tcu *)&srcFbo,(Vector<bool,_4> *)&dstFbo,&srcIsGreater);
  tcu::select<float,4>
            ((tcu *)&gradientToSrcShader,&dstFmtRangeInfo.valueMin,&srcFmtRangeInfo.valueMin,
             (Vector<bool,_4> *)&srcFbo);
  tcu::logicalNot<bool,4>((tcu *)&dstRbo,&copyMask);
  tcu::logicalOr<bool,4>((tcu *)&srcRbo,(Vector<bool,_4> *)&dstRbo,&srcIsGreater);
  tcu::select<float,4>
            ((tcu *)&gradientToDstShader,&dstFmtRangeInfo.valueMax,&srcFmtRangeInfo.valueMax,
             (Vector<bool,_4> *)&srcRbo);
  tcu::logicalNot<bool,4>(local_3f0,&copyMask);
  tcu::logicalOr<bool,4>(local_3ec,(Vector<bool,_4> *)local_3f0,&srcIsGreater);
  tcu::select<float,4>
            ((tcu *)&local_418,&dstFmtRangeInfo.lookupScale,&srcFmtRangeInfo.lookupScale,
             (Vector<bool,_4> *)local_3ec);
  tcu::logicalNot<bool,4>(local_3f8,&copyMask);
  tcu::logicalOr<bool,4>(local_3f4,(Vector<bool,_4> *)local_3f8,&srcIsGreater);
  tcu::select<float,4>
            ((tcu *)&local_428,&dstFmtRangeInfo.lookupBias,&srcFmtRangeInfo.lookupBias,
             (Vector<bool,_4> *)local_3f4);
  tcu::TextureFormatInfo::TextureFormatInfo
            (&dstRangeInfo,(Vec4 *)&gradientToSrcShader,(Vec4 *)&gradientToDstShader,
             (Vec4 *)&local_418,(Vec4 *)&local_428);
  FboTestUtil::GradientShader::GradientShader(&gradientToSrcShader,local_444);
  FboTestUtil::GradientShader::GradientShader(&gradientToDstShader,local_440);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_440 = (*pCVar1->_vptr_Context[0x75])(pCVar1,&gradientToSrcShader);
  pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_444 = (*pCVar1->_vptr_Context[0x75])(pCVar1);
  iVar4 = 2;
  while (iVar4 != 0) {
    bVar5 = iVar4 == 2;
    pdVar2 = &dstFbo;
    if (bVar5) {
      pdVar2 = &srcFbo;
    }
    renderbuffers = &dstRbo;
    if (bVar5) {
      renderbuffers = &srcRbo;
    }
    pdVar3 = &this->m_dstFormat;
    if (bVar5) {
      pdVar3 = &this->m_srcFormat;
    }
    internalformat = *pdVar3;
    sglr::ContextWrapper::glGenFramebuffers(this_00,1,pdVar2);
    sglr::ContextWrapper::glGenRenderbuffers(this_00,1,renderbuffers);
    sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,*renderbuffers);
    sglr::ContextWrapper::glRenderbufferStorage
              (this_00,0x8d41,internalformat,(this->m_size).m_data[0],(this->m_size).m_data[1]);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,*pdVar2);
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,*renderbuffers);
    FboTestCase::checkError(&this->super_FboTestCase);
    FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
    iVar4 = iVar4 + -1;
  }
  sglr::ContextWrapper::glViewport(this_00,0,0,(this->m_size).m_data[0],(this->m_size).m_data[1]);
  iVar4 = 2;
  while (iVar4 != 0) {
    pdVar2 = &dstFbo;
    if (iVar4 == 2) {
      pdVar2 = &srcFbo;
    }
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,*pdVar2);
    if (iVar4 == 2) {
      pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
      FboTestUtil::GradientShader::setGradient
                (&gradientToSrcShader,pCVar1,local_440,&srcRangeInfo.valueMin,&dstRangeInfo.valueMax
                );
      pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
      local_418.m_data[0] = -1.0;
      local_418.m_data[1] = -1.0;
      local_418.m_data[2] = 0.0;
      local_428.m_data[0] = 1.0;
      local_428.m_data[1] = 1.0;
      local_428.m_data[2] = 0.0;
      sglr::drawQuad(pCVar1,local_440,&local_418,&local_428);
      iVar4 = iVar4 + -1;
    }
    else {
      pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
      FboTestUtil::GradientShader::setGradient
                (&gradientToDstShader,pCVar1,local_444,&dstRangeInfo.valueMax,&dstRangeInfo.valueMin
                );
      pCVar1 = sglr::ContextWrapper::getCurrentContext(this_00);
      local_418.m_data[0] = -1.0;
      local_418.m_data[1] = -1.0;
      local_418.m_data[2] = 0.0;
      local_428.m_data[0] = 1.0;
      local_428.m_data[1] = 1.0;
      local_428.m_data[2] = 0.0;
      sglr::drawQuad(pCVar1,local_444,&local_418,&local_428);
      iVar4 = iVar4 + -1;
    }
  }
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,srcFbo);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca9,dstFbo);
  iVar4 = (this->m_size).m_data[0];
  srcY1 = (this->m_size).m_data[1];
  sglr::ContextWrapper::glBlitFramebuffer(this_00,0,0,iVar4,srcY1,0,0,iVar4,srcY1,0x4000,0x2600);
  FboTestCase::checkError(&this->super_FboTestCase);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,dstFbo);
  FboTestCase::readPixels
            (&this->super_FboTestCase,local_408,0,0,(this->m_size).m_data[0],
             (this->m_size).m_data[1],&dstFormat,&dstRangeInfo.lookupScale,&dstRangeInfo.lookupBias)
  ;
  sglr::ShaderProgram::~ShaderProgram(&gradientToDstShader.super_ShaderProgram);
  sglr::ShaderProgram::~ShaderProgram(&gradientToSrcShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		srcFormat			= glu::mapGLInternalFormat(m_srcFormat);
		tcu::TextureFormat		dstFormat			= glu::mapGLInternalFormat(m_dstFormat);
		glu::DataType			srcOutputType		= getFragmentOutputType(srcFormat);
		glu::DataType			dstOutputType		= getFragmentOutputType(dstFormat);

		// Compute ranges \note Doesn't handle case where src or dest is not subset of the another!
		tcu::TextureFormatInfo	srcFmtRangeInfo		= tcu::getTextureFormatInfo(srcFormat);
		tcu::TextureFormatInfo	dstFmtRangeInfo		= tcu::getTextureFormatInfo(dstFormat);
		tcu::BVec4				copyMask			= tcu::logicalAnd(getChannelMask(srcFormat.order), getChannelMask(dstFormat.order));
		tcu::BVec4				srcIsGreater		= tcu::greaterThan(srcFmtRangeInfo.valueMax-srcFmtRangeInfo.valueMin, dstFmtRangeInfo.valueMax-dstFmtRangeInfo.valueMin);
		tcu::TextureFormatInfo	srcRangeInfo		(tcu::select(dstFmtRangeInfo.valueMin,		srcFmtRangeInfo.valueMin,		tcu::logicalAnd(copyMask, srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.valueMax,		srcFmtRangeInfo.valueMax,		tcu::logicalAnd(copyMask, srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupScale,	srcFmtRangeInfo.lookupScale,	tcu::logicalAnd(copyMask, srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupBias,	srcFmtRangeInfo.lookupBias,		tcu::logicalAnd(copyMask, srcIsGreater)));
		tcu::TextureFormatInfo	dstRangeInfo		(tcu::select(dstFmtRangeInfo.valueMin,		srcFmtRangeInfo.valueMin,		tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.valueMax,		srcFmtRangeInfo.valueMax,		tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupScale,	srcFmtRangeInfo.lookupScale,	tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupBias,	srcFmtRangeInfo.lookupBias,		tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)));

		// Shaders.
		GradientShader			gradientToSrcShader	(srcOutputType);
		GradientShader			gradientToDstShader	(dstOutputType);

		deUint32				gradShaderSrcID		= getCurrentContext()->createProgram(&gradientToSrcShader);
		deUint32				gradShaderDstID		= getCurrentContext()->createProgram(&gradientToDstShader);

		deUint32				srcFbo, dstFbo;
		deUint32				srcRbo, dstRbo;

		// Create framebuffers.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			deUint32&	fbo		= ndx ? dstFbo : srcFbo;
			deUint32&	rbo		= ndx ? dstRbo : srcRbo;
			deUint32	format	= ndx ? m_dstFormat : m_srcFormat;

			glGenFramebuffers(1, &fbo);
			glGenRenderbuffers(1, &rbo);

			glBindRenderbuffer(GL_RENDERBUFFER, rbo);
			glRenderbufferStorage(GL_RENDERBUFFER, format, m_size.x(), m_size.y());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		glViewport(0, 0, m_size.x(), m_size.y());

		// Render gradients.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			glBindFramebuffer(GL_FRAMEBUFFER, ndx ? dstFbo : srcFbo);

			if (ndx)
			{
				gradientToDstShader.setGradient(*getCurrentContext(), gradShaderDstID, dstRangeInfo.valueMax, dstRangeInfo.valueMin);
				sglr::drawQuad(*getCurrentContext(), gradShaderDstID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			}
			else
			{
				gradientToSrcShader.setGradient(*getCurrentContext(), gradShaderSrcID, srcRangeInfo.valueMin, dstRangeInfo.valueMax);
				sglr::drawQuad(*getCurrentContext(), gradShaderSrcID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			}
		}

		// Execute copy.
		glBindFramebuffer(GL_READ_FRAMEBUFFER, srcFbo);
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, dstFbo);
		glBlitFramebuffer(0, 0, m_size.x(), m_size.y(), 0, 0, m_size.x(), m_size.y(), GL_COLOR_BUFFER_BIT, GL_NEAREST);
		checkError();

		// Read results.
		glBindFramebuffer(GL_READ_FRAMEBUFFER, dstFbo);
		readPixels(dst, 0, 0, m_size.x(), m_size.y(), dstFormat, dstRangeInfo.lookupScale, dstRangeInfo.lookupBias);
	}